

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hxx
# Opt level: O0

size_t lineage::loadNodes(string *fileName,Problem *problem)

{
  undefined1 uVar1;
  istream *piVar2;
  long *plVar3;
  value_type *pvVar4;
  long in_RSI;
  undefined8 in_RDI;
  size_t counter;
  Node node;
  ifstream file;
  value_type_conflict1 *in_stack_fffffffffffffd68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd70;
  value_type *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  size_t local_240;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  double local_228;
  istream local_220 [520];
  undefined8 local_18;
  long local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<lineage::Node,_std::allocator<lineage::Node>_>::clear
            ((vector<lineage::Node,_std::allocator<lineage::Node>_> *)0x144904);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x144915);
  local_18 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::ifstream::ifstream(local_220,local_8,8);
  local_240 = 0;
  while( true ) {
    piVar2 = (istream *)std::istream::operator>>(local_220,&local_238);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&local_234);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&local_230);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&local_22c);
    plVar3 = (long *)std::istream::operator>>(piVar2,&local_228);
    uVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (!(bool)uVar1) break;
    in_stack_fffffffffffffd78 = (value_type *)(long)local_238;
    pvVar4 = (value_type *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_10 + 0x30));
    if (in_stack_fffffffffffffd78 == pvVar4) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT17(uVar1,in_stack_fffffffffffffd80),
                 (value_type_conflict1 *)in_stack_fffffffffffffd78);
    }
    std::vector<lineage::Node,_std::allocator<lineage::Node>_>::push_back
              ((vector<lineage::Node,_std::allocator<lineage::Node>_> *)
               CONCAT17(uVar1,in_stack_fffffffffffffd80),in_stack_fffffffffffffd78);
    local_240 = local_240 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(uVar1,in_stack_fffffffffffffd80),
             (value_type_conflict1 *)in_stack_fffffffffffffd78);
  std::ifstream::close();
  std::ifstream::~ifstream(local_220);
  return local_240;
}

Assistant:

inline
size_t loadNodes(const std::string& fileName, Problem& problem)
{
    problem.nodes.clear();
    problem.node_offsets.clear();
    problem.node_offsets.push_back(0);

    std::ifstream file(fileName);

    Node node;
    size_t counter = 0;
    while (file >> node.t >> node.id >> node.cx >> node.cy >> node.probability_birth_termination)
    {
        if (node.t == problem.node_offsets.size())
            problem.node_offsets.push_back(counter);

        problem.nodes.push_back(node);
        ++counter;
    }

    problem.node_offsets.push_back(counter);

    file.close();

    return counter;
}